

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_ef4738::Joystick::did_set_input
          (Joystick *this,Input *digital_input,bool is_active)

{
  ushort uVar1;
  
  switch(digital_input->type) {
  case Up:
    this->kempston_ = is_active * '\b' | this->kempston_ & 0xf7;
    if (is_active) {
      uVar1 = this->sinclair_ & 0xf7fd;
    }
    else {
      uVar1 = this->sinclair_ | 0x802;
    }
    break;
  case Down:
    this->kempston_ = is_active * '\x04' | this->kempston_ & 0xfb;
    if (is_active) {
      uVar1 = this->sinclair_ & 0xfbfb;
    }
    else {
      uVar1 = this->sinclair_ | 0x404;
    }
    break;
  case Left:
    this->kempston_ = is_active * '\x02' | this->kempston_ & 0xfd;
    if (is_active) {
      uVar1 = this->sinclair_ & 0xfeef;
    }
    else {
      uVar1 = this->sinclair_ | 0x110;
    }
    break;
  case Right:
    this->kempston_ = this->kempston_ & 0xfe | is_active;
    if (is_active) {
      uVar1 = this->sinclair_ & 0xfdf7;
    }
    else {
      uVar1 = this->sinclair_ | 0x208;
    }
    break;
  default:
    goto switchD_003a032e_caseD_4;
  case Fire:
    this->kempston_ = is_active << 4 | this->kempston_ & 0xef;
    if (is_active) {
      uVar1 = this->sinclair_ & 0xeffe;
    }
    else {
      uVar1 = this->sinclair_ | 0x1001;
    }
  }
  this->sinclair_ = uVar1;
switchD_003a032e_caseD_4:
  return;
}

Assistant:

void did_set_input(const Input &digital_input, bool is_active) final {
#define APPLY(b)	if(is_active) state_ &= ~b; else state_ |= b;
			switch(digital_input.type) {
				default: return;
				case Input::Right:	APPLY(0x02);	break;
				case Input::Left:	APPLY(0x01);	break;
				case Input::Down:	APPLY(0x08);	break;
				case Input::Up:		APPLY(0x10);	break;
				case Input::Fire:	APPLY(0x20);	break;
			}
#undef APPLY
		}